

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-configure.c
# Opt level: O1

int run_test_loop_configure(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop_00;
  uv_loop_t *loop_01;
  uv_timer_t timer_handle;
  uv_loop_t loop;
  undefined1 auStack_3e8 [1000];
  
  loop_01 = (uv_loop_t *)auStack_3e8;
  loop_00 = (uv_loop_t *)(auStack_3e8 + 0x98);
  iVar1 = uv_loop_init(loop_00);
  if (iVar1 == 0) {
    loop_00 = (uv_loop_t *)(auStack_3e8 + 0x98);
    iVar1 = uv_loop_configure(loop_00,UV_LOOP_BLOCK_SIGNAL,0x1b);
    if (iVar1 != 0) goto LAB_001612db;
    loop_00 = (uv_loop_t *)(auStack_3e8 + 0x98);
    iVar1 = uv_timer_init(loop_00,(uv_timer_t *)auStack_3e8);
    if (iVar1 != 0) goto LAB_001612e0;
    iVar1 = uv_timer_start((uv_timer_t *)auStack_3e8,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_001612e5;
    loop_01 = (uv_loop_t *)(auStack_3e8 + 0x98);
    iVar1 = uv_run(loop_01,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      loop_01 = (uv_loop_t *)(auStack_3e8 + 0x98);
      iVar1 = uv_loop_close(loop_01);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001612ef;
    }
  }
  else {
    run_test_loop_configure_cold_1();
LAB_001612db:
    run_test_loop_configure_cold_2();
LAB_001612e0:
    loop_01 = loop_00;
    run_test_loop_configure_cold_3();
LAB_001612e5:
    run_test_loop_configure_cold_4();
  }
  run_test_loop_configure_cold_5();
LAB_001612ef:
  run_test_loop_configure_cold_6();
  uv_close((uv_handle_t *)loop_01,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_configure) {
  uv_timer_t timer_handle;
  uv_loop_t loop;
  ASSERT(0 == uv_loop_init(&loop));
#ifdef _WIN32
  ASSERT(UV_ENOSYS == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, 0));
#else
  ASSERT(0 == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, SIGPROF));
#endif
  ASSERT(0 == uv_timer_init(&loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT(0 == uv_loop_close(&loop));
  return 0;
}